

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O1

unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
 __thiscall
JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::operator->
          (JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *this)

{
  char cVar1;
  WrappedInt<HalfCycles> duration;
  _Head_base<0UL,_Atari::ST::Video_*,_false> in_RDX;
  Video *extraout_RDX;
  _func_int **in_RSI;
  unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar2;
  
  LOCK();
  cVar1 = *(char *)(in_RSI + 0x5f);
  *(char *)(in_RSI + 0x5f) = '\x01';
  UNLOCK();
  if (cVar1 == '\0') {
    if (*(char *)(in_RSI + 0x5e) == '\0') {
      *(undefined2 *)(in_RSI + 0x5e) = 0x101;
      duration.length_ = ((WrappedInt<HalfCycles> *)(in_RSI + 0x5b))->length_;
      in_RSI[0x5b] = (_func_int *)0x0;
      Atari::ST::Video::run_for((Video *)(in_RSI + 1),(HalfCycles)duration.length_);
      in_RDX._M_head_impl = extraout_RDX;
    }
    LOCK();
    *(undefined1 *)(in_RSI + 0x5f) = 0;
    UNLOCK();
    (this->super_Observer)._vptr_Observer = in_RSI;
    (this->object_).deferrer_.pending_actions_.
    super__Vector_base<DeferredQueue<HalfCycles>::DeferredAction,_std::allocator<DeferredQueue<HalfCycles>::DeferredAction>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(in_RSI + 1);
    uVar2._M_t.
    super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_Atari::ST::Video_*,_false>._M_head_impl = in_RDX._M_head_impl;
    uVar2._M_t.
    super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Tuple_impl<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    .
    super__Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter,_false>
            )this;
    return (unique_ptr<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
            )uVar2._M_t.
             super___uniq_ptr_impl<Atari::ST::Video,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_Atari::ST::Video_*,_JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ;
  }
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/../../../ClockReceiver/JustInTime.hpp"
                ,0x7e,
                "auto JustInTimeActor<Atari::ST::Video>::operator->() [T = Atari::ST::Video, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
               );
}

Assistant:

[[nodiscard]] forceinline auto operator->() {
#ifndef NDEBUG
			assert(!flush_concurrency_check_.test_and_set());
#endif
			flush();
#ifndef NDEBUG
			flush_concurrency_check_.clear();
#endif
			return std::unique_ptr<T, SequencePointAwareDeleter>(&object_, SequencePointAwareDeleter(this));
		}